

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O1

uint __thiscall
SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u>::Lookup<false,false>
          (SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u> *this,uint index)

{
  uint index_00;
  long lVar1;
  uint uVar2;
  uint uVar3;
  
  if (index < *(uint *)this) {
    uVar2 = index >> 4;
    lVar1 = *(long *)(*(long *)(this + 8) + (ulong)uVar2 * 8);
    if (lVar1 != 0) {
      uVar3 = index & 0xf;
      index_00 = *(uint *)(lVar1 + (ulong)uVar3 * 4);
      if (index_00 != index) {
        index = Lookup<false,false>(this,index_00);
        *(uint *)(*(long *)(*(long *)(this + 8) + (ulong)uVar2 * 8) + (ulong)uVar3 * 4) = index;
      }
    }
  }
  return index;
}

Assistant:

inline indexType Lookup(indexType index)
    {
        if (index >= maxIndex || backingStore[index / numPerSegment] == nullptr)
        {
            // Not being there simply means that it's still an identity mapping
            if(createBacking)
            {
                CreateBacking(index);
            }
            return index;
        }
        if (assumeConsolidated)
        {
            // If the list is consolidated, then we can return whatever's there
            return backingStore[index / numPerSegment][index % numPerSegment];
        }
        else
        {
            // If it's not consolidated, we need to follow the chain down, and update each entry to the root
            indexType currentValue = backingStore[index / numPerSegment][index % numPerSegment];
            if (currentValue == index)
            {
                return index;
            }
            indexType trueRoot = Lookup<false, assumeConsolidated>(currentValue);
            backingStore[index / numPerSegment][index % numPerSegment] = trueRoot;
            return trueRoot;
        }
    }